

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

void __thiscall wasm::AvoidReinterprets::visitUnary(AvoidReinterprets *this,Unary *curr)

{
  LocalGraph *localGraph;
  bool bVar1;
  PassOptions *pPVar2;
  Module *pMVar3;
  Expression *pEVar4;
  Load *get_00;
  mapped_type *pmVar5;
  mapped_type *info;
  Load *load;
  LocalGet *get;
  Unary *curr_local;
  AvoidReinterprets *this_local;
  
  get = (LocalGet *)curr;
  curr_local = (Unary *)this;
  bVar1 = isReinterpret(curr);
  if (bVar1) {
    pEVar4 = *(Expression **)
              &get[1].super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression;
    pPVar2 = Pass::getPassOptions((Pass *)this);
    pMVar3 = Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                        ).
                        super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                        .
                        super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                      );
    pEVar4 = Properties::getFallthrough(pEVar4,pPVar2,pMVar3,AllowTeeBrIf);
    get_00 = (Load *)Expression::dynCast<wasm::LocalGet>(pEVar4);
    if (get_00 != (Load *)0x0) {
      localGraph = this->localGraph;
      load = get_00;
      pPVar2 = Pass::getPassOptions((Pass *)this);
      pMVar3 = Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                          ).
                          super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                          .
                          super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                        );
      info = (mapped_type *)getSingleLoad(localGraph,(LocalGet *)get_00,pPVar2,pMVar3);
      if ((Load *)info != (Load *)0x0) {
        pmVar5 = std::
                 map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
                 ::operator[](&this->infos,(key_type *)&info);
        pmVar5->reinterpreted = true;
      }
    }
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (isReinterpret(curr)) {
      if (auto* get = Properties::getFallthrough(
                        curr->value, getPassOptions(), *getModule())
                        ->dynCast<LocalGet>()) {
        if (auto* load =
              getSingleLoad(localGraph, get, getPassOptions(), *getModule())) {
          auto& info = infos[load];
          info.reinterpreted = true;
        }
      }
    }
  }